

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_NewClass1(JSRuntime *rt,JSClassID class_id,JSClassDef *class_def,JSAtom name)

{
  list_head *plVar1;
  JSClassGCMark *pJVar2;
  JSClassExoticMethods *pJVar3;
  int iVar4;
  list_head *plVar5;
  JSClass *pJVar6;
  long lVar7;
  uint uVar8;
  list_head **pplVar9;
  ulong uVar10;
  
  iVar4 = -1;
  if (class_id < 0x10000) {
    uVar8 = rt->class_count;
    if (class_id < uVar8) {
      pJVar6 = rt->class_array;
      if (pJVar6[class_id].class_id != 0) {
        return -1;
      }
    }
    else {
      uVar8 = (uVar8 >> 1) + uVar8;
      if (uVar8 < class_id + 1) {
        uVar8 = class_id + 1;
      }
      uVar10 = 0x33;
      if (0x33 < uVar8) {
        uVar10 = (ulong)uVar8;
      }
      plVar1 = &rt->context_list;
      while (plVar1 = plVar1->next, plVar1 != &rt->context_list) {
        plVar5 = (list_head *)(*(rt->mf).js_realloc)(&rt->malloc_state,plVar1[2].prev,uVar10 << 4);
        if (plVar5 == (list_head *)0x0) {
          return -1;
        }
        lVar7 = (long)rt->class_count;
        pplVar9 = &plVar5[lVar7].next;
        for (; lVar7 < (long)uVar10; lVar7 = lVar7 + 1) {
          *(undefined4 *)&((list_head *)(pplVar9 + -1))->prev = 0;
          *pplVar9 = (list_head *)0x2;
          pplVar9 = pplVar9 + 2;
        }
        plVar1[2].prev = plVar5;
      }
      pJVar6 = (JSClass *)(*(rt->mf).js_realloc)(&rt->malloc_state,rt->class_array,uVar10 * 0x28);
      if (pJVar6 == (JSClass *)0x0) {
        return -1;
      }
      memset(pJVar6 + rt->class_count,0,((long)(int)uVar10 - (long)rt->class_count) * 0x28);
      rt->class_array = pJVar6;
      rt->class_count = (int)uVar10;
    }
    pJVar6[class_id].class_id = class_id;
    if (0xd1 < (int)name) {
      (rt->atom_array[name]->header).ref_count = (rt->atom_array[name]->header).ref_count + 1;
    }
    pJVar6[class_id].class_name = name;
    pJVar2 = class_def->gc_mark;
    pJVar6[class_id].finalizer = class_def->finalizer;
    pJVar6[class_id].gc_mark = pJVar2;
    pJVar3 = class_def->exotic;
    pJVar6[class_id].call = class_def->call;
    pJVar6[class_id].exotic = pJVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int JS_NewClass1(JSRuntime *rt, JSClassID class_id,
                        const JSClassDef *class_def, JSAtom name)
{
    int new_size, i;
    JSClass *cl, *new_class_array;
    struct list_head *el;

    if (class_id >= (1 << 16))
        return -1;
    if (class_id < rt->class_count &&
        rt->class_array[class_id].class_id != 0)
        return -1;

    if (class_id >= rt->class_count) {
        new_size = max_int(JS_CLASS_INIT_COUNT,
                           max_int(class_id + 1, rt->class_count * 3 / 2));

        /* reallocate the context class prototype array, if any */
        list_for_each(el, &rt->context_list) {
            JSContext *ctx = list_entry(el, JSContext, link);
            JSValue *new_tab;
            new_tab = js_realloc_rt(rt, ctx->class_proto,
                                    sizeof(ctx->class_proto[0]) * new_size);
            if (!new_tab)
                return -1;
            for(i = rt->class_count; i < new_size; i++)
                new_tab[i] = JS_NULL;
            ctx->class_proto = new_tab;
        }
        /* reallocate the class array */
        new_class_array = js_realloc_rt(rt, rt->class_array,
                                        sizeof(JSClass) * new_size);
        if (!new_class_array)
            return -1;
        memset(new_class_array + rt->class_count, 0,
               (new_size - rt->class_count) * sizeof(JSClass));
        rt->class_array = new_class_array;
        rt->class_count = new_size;
    }
    cl = &rt->class_array[class_id];
    cl->class_id = class_id;
    cl->class_name = JS_DupAtomRT(rt, name);
    cl->finalizer = class_def->finalizer;
    cl->gc_mark = class_def->gc_mark;
    cl->call = class_def->call;
    cl->exotic = class_def->exotic;
    return 0;
}